

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tga.c
# Opt level: O3

sptr_t tga_write(sptr_t buf,image_data image,int expand)

{
  uchar *__dest;
  long lVar1;
  uchar *puVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  uchar uVar8;
  uchar uVar9;
  uchar *puVar10;
  bool bVar11;
  sptr_t sVar12;
  sptr_t sVar13;
  uchar *local_38;
  
  uVar6 = buf.size;
  puVar2 = buf.ptr;
  uVar3 = 0;
  puVar10 = (uchar *)0x0;
  if (((0xfd < (byte)(image.type - 3)) && (image.palette.data.ptr != (uchar *)0x0)) &&
     (image.palette.type == '\x01')) {
    if (expand == 0) {
      lVar1 = image.pixels.size + 0x312;
    }
    else {
      lVar1 = (4 - (ulong)(image.alpha_pixels == 0)) * image.pixels.size + 0x12;
    }
    uVar3 = 0;
    puVar10 = (uchar *)0x0;
    if (lVar1 - 1U < uVar6) {
      memset(puVar2,0,uVar6);
      bVar11 = expand == 0;
      *puVar2 = '\0';
      puVar2[1] = bVar11;
      uVar8 = '\x18';
      if (!bVar11) {
        uVar8 = '\0';
      }
      puVar2[2] = '\x02' - bVar11;
      local_38 = puVar2 + 3;
      write_le16(0,&local_38);
      write_le16((ushort)bVar11 << 8,&local_38);
      *local_38 = uVar8;
      local_38 = local_38 + 1;
      write_le16(0,&local_38);
      write_le16(0,&local_38);
      write_le16((uint16_t)image.width,&local_38);
      write_le16((uint16_t)image.height,&local_38);
      __dest = puVar2 + 0x12;
      uVar8 = '\b';
      if (expand != 0) {
        uVar8 = (image.alpha_pixels != 0) * '\b' + '\x18';
      }
      *local_38 = uVar8;
      local_38[1] = ' ';
      uVar3 = uVar6;
      puVar10 = puVar2;
      if (expand == 0) {
        memcpy(__dest,image.palette.data.ptr,image.palette.data.size);
        sVar12.size = uVar6 - 0x12;
        sVar12.ptr = __dest;
        sVar12 = sptr_slice(sVar12,0,image.palette.data.size);
        flip_bgr(sVar12);
        memcpy(__dest + image.palette.data.size,image.pixels.ptr,image.pixels.size);
      }
      else {
        uVar5 = (uint)image.pixels.size;
        if (image.alpha_pixels == 0) {
          if (0 < (int)uVar5) {
            puVar2 = puVar2 + 0x14;
            uVar6 = 0;
            do {
              lVar1 = (ulong)image.pixels.ptr[uVar6] * 3;
              puVar2[-2] = image.palette.data.ptr[lVar1 + 2];
              puVar2[-1] = image.palette.data.ptr[lVar1 + 1];
              *puVar2 = image.palette.data.ptr[lVar1];
              uVar6 = uVar6 + 1;
              puVar2 = puVar2 + 3;
            } while ((uVar5 & 0x7fffffff) != uVar6);
          }
        }
        else if (0 < (int)uVar5) {
          uVar6 = (ulong)(uVar5 & 0x7fffffff);
          lVar1 = 0;
          lVar4 = 0;
          do {
            if ((ulong)*image.pixels.ptr == 0xff) {
              lVar7 = lVar4 * 4;
              (puVar2 + lVar1 + 0x12)[0] = '\0';
              (puVar2 + lVar1 + 0x12)[1] = '\0';
              uVar8 = '\0';
              uVar9 = '\0';
            }
            else {
              lVar7 = (ulong)*image.pixels.ptr * 3;
              puVar2[lVar1 + 0x12] = image.palette.data.ptr[lVar7 + 2];
              puVar2[lVar1 + 0x13] = image.palette.data.ptr[lVar7 + 1];
              uVar8 = image.palette.data.ptr[lVar7];
              uVar9 = 0xff;
              lVar7 = lVar1;
            }
            puVar2[lVar7 + 0x14] = uVar8;
            puVar2[lVar7 + 0x15] = uVar9;
            lVar4 = lVar4 + 1;
            image.pixels.ptr = image.pixels.ptr + 1;
            lVar1 = lVar1 + 4;
            uVar6 = uVar6 - 1;
          } while (uVar6 != 0);
        }
      }
    }
  }
  sVar13.size = uVar3;
  sVar13.ptr = puVar10;
  return sVar13;
}

Assistant:

sptr_t tga_write(sptr_t buf, struct image_data image, int expand)
{
	size_t size = tga_estimate_size(image, expand);
	if (size == 0 || buf.size < size) {
		return SPTR_NULL;
	}
	memset(buf.ptr, 0, buf.size);
	sptr_t cm_offset = tga_write_header(buf, image, expand);
	if (!expand)
	{
		/* copy palette data */
		memcpy(cm_offset.ptr, image.palette.data.ptr, image.palette.data.size);
		/* flip from RGB to BGR in place */
		sptr_t cm_palette = sptr_slice(cm_offset, 0, image.palette.data.size);
		flip_bgr(cm_palette);
		/* copy pixel data */
		memcpy(cm_offset.ptr + image.palette.data.size, image.pixels.ptr,
			image.pixels.size);
	}
	else
	{
		unsigned char *buf = cm_offset.ptr;
		int num_pixels = image.pixels.size;
		if (image.alpha_pixels)
		{
			/* write BGRA */
			for (int i = 0; i < num_pixels; i++)
			{
				int j = image.pixels.ptr[i];

				if (j == 255)
				{
					// transparent, so scan around for another color
				    // to avoid alpha fringes
				    // FIXME: do a full flood fill so mips work...
					/*
				    if (i > image.width && image.pixels.ptr[i-image.width] != 255)
					    j = image.pixels.ptr[i-image.width];
				    else if (i < num_pixels-image.width && image.pixels.ptr[i+image.width] != 255)
					    j = image.pixels.ptr[i+image.width];
				    else if (i > 0 && image.pixels.ptr[i-1] != 255)
					    j = image.pixels.ptr[i-1];
				    else if (i < num_pixels-1 && image.pixels.ptr[i+1] != 255)
					    j = image.pixels.ptr[i+1];
				    else
					    j = 0;

					buf[i * 4 + 0] = image.palette.data.ptr[j * 3 + 2];
					buf[i * 4 + 1] = image.palette.data.ptr[j * 3 + 1];
					buf[i * 4 + 2] = image.palette.data.ptr[j * 3 + 0];
					*/
					buf[i * 4 + 0] = 0;
					buf[i * 4 + 1] = 0;
					buf[i * 4 + 2] = 0;
					buf[i * 4 + 3] = 0;
				}
				else
				{
					buf[i * 4 + 0] = image.palette.data.ptr[j * 3 + 2];
					buf[i * 4 + 1] = image.palette.data.ptr[j * 3 + 1];
					buf[i * 4 + 2] = image.palette.data.ptr[j * 3 + 0];
					buf[i * 4 + 3] = 255;
				}
			}
		}
		else
		{
			/* write BGR */
			for (int i = 0; i < num_pixels; i++)
			{
				int j = image.pixels.ptr[i] * 3;

				buf[i * 3 + 0] = image.palette.data.ptr[j + 2];
				buf[i * 3 + 1] = image.palette.data.ptr[j + 1];
				buf[i * 3 + 2] = image.palette.data.ptr[j + 0];
			}
		}
	}
	return buf;
}